

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall wabt::SharedValidator::OnStart(SharedValidator *this,Location *loc,Var *func_var)

{
  Index IVar1;
  Result RVar2;
  byte bVar3;
  bool bVar4;
  FuncType func_type;
  FuncType local_a8;
  Var local_78;
  
  IVar1 = this->starts_;
  this->starts_ = IVar1 + 1;
  if (IVar1 == 0) {
    bVar4 = false;
  }
  else {
    RVar2 = PrintError(this,loc,"only one start function allowed");
    bVar4 = RVar2.enum_ == Error;
  }
  local_a8.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Var::Var(&local_78,func_var);
  RVar2 = CheckFuncIndex(this,&local_78,&local_a8);
  bVar3 = RVar2.enum_ == Error | bVar4;
  Var::~Var(&local_78);
  if (local_a8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_a8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start) {
    RVar2 = PrintError(this,loc,"start function must be nullary");
    bVar3 = bVar3 | RVar2.enum_ == Error;
  }
  if (local_a8.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_a8.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start) {
    RVar2 = PrintError(this,loc,"start function must not return anything");
    bVar3 = bVar3 | RVar2.enum_ == Error;
  }
  FuncType::~FuncType(&local_a8);
  return (Result)(uint)bVar3;
}

Assistant:

Result SharedValidator::OnStart(const Location& loc, Var func_var) {
  Result result = Result::Ok;
  if (starts_++ > 0) {
    result |= PrintError(loc, "only one start function allowed");
  }
  FuncType func_type;
  result |= CheckFuncIndex(func_var, &func_type);
  if (func_type.params.size() != 0) {
    result |= PrintError(loc, "start function must be nullary");
  }
  if (func_type.results.size() != 0) {
    result |= PrintError(loc, "start function must not return anything");
  }
  return result;
}